

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall
ON_OffsetSurfaceFunction::SetDistance(ON_OffsetSurfaceFunction *this,int index,double distance)

{
  int iVar1;
  ON_OffsetSurfaceValue *pOVar2;
  int count;
  double distance_local;
  int index_local;
  ON_OffsetSurfaceFunction *this_local;
  
  iVar1 = ON_SimpleArray<ON_OffsetSurfaceValue>::Count(&this->m_offset_value);
  if ((index < 0) || (iVar1 + -1 < index)) {
    this_local._7_1_ = false;
  }
  else {
    pOVar2 = ON_SimpleArray<ON_OffsetSurfaceValue>::operator[](&this->m_offset_value,index);
    pOVar2->m_distance = distance;
    this->m_bValid = false;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetDistance( int index, double distance)
{
  int count = m_offset_value.Count();
  if( index < 0 || index > count-1)
    return false;

  m_offset_value[index].m_distance = distance;
  m_bValid = false;

  return true;
}